

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose_sse2.h
# Opt level: O0

void transpose_16bit_4x4(__m128i *in,__m128i *out)

{
  longlong lVar1;
  longlong lVar2;
  undefined2 uStack_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  __m128i a1;
  __m128i a0;
  __m128i *out_local;
  __m128i *in_local;
  undefined4 uStack_44;
  undefined4 uStack_34;
  undefined4 uStack_1c;
  undefined4 uStack_c;
  
  lVar1 = (*in)[0];
  lVar2 = in[1][0];
  in_local._0_2_ = (undefined2)lVar1;
  in_local._2_2_ = (undefined2)((ulong)lVar1 >> 0x10);
  in_local._4_2_ = (undefined2)((ulong)lVar1 >> 0x20);
  in_local._6_2_ = (undefined2)((ulong)lVar1 >> 0x30);
  a0[1]._0_2_ = (undefined2)lVar2;
  a0[1]._2_2_ = (undefined2)((ulong)lVar2 >> 0x10);
  a0[1]._4_2_ = (undefined2)((ulong)lVar2 >> 0x20);
  a0[1]._6_2_ = (undefined2)((ulong)lVar2 >> 0x30);
  lVar1 = in[2][0];
  lVar2 = in[3][0];
  a1[1]._0_2_ = (undefined2)lVar1;
  a1[1]._2_2_ = (undefined2)((ulong)lVar1 >> 0x10);
  a1[1]._4_2_ = (undefined2)((ulong)lVar1 >> 0x20);
  a1[1]._6_2_ = (undefined2)((ulong)lVar1 >> 0x30);
  uStack_88 = (undefined2)lVar2;
  uStack_86 = (undefined2)((ulong)lVar2 >> 0x10);
  uStack_84 = (undefined2)((ulong)lVar2 >> 0x20);
  uStack_82 = (undefined2)((ulong)lVar2 >> 0x30);
  uStack_34 = (undefined4)
              (CONCAT26(a0[1]._2_2_,
                        CONCAT24(in_local._2_2_,CONCAT22((undefined2)a0[1],in_local._0_2_))) >> 0x20
              );
  uStack_44 = (undefined4)
              (CONCAT26(uStack_86,CONCAT24(a1[1]._2_2_,CONCAT22(uStack_88,(undefined2)a1[1]))) >>
              0x20);
  *(uint *)*out = CONCAT22((undefined2)a0[1],in_local._0_2_);
  *(uint *)((long)*out + 4) = CONCAT22(uStack_88,(undefined2)a1[1]);
  *(undefined4 *)(*out + 1) = uStack_34;
  *(undefined4 *)((long)*out + 0xc) = uStack_44;
  out[1][0] = (*out)[1];
  out[1][1] = 0;
  uStack_c = (undefined4)
             (CONCAT26(a0[1]._6_2_,CONCAT24(in_local._6_2_,CONCAT22(a0[1]._4_2_,in_local._4_2_))) >>
             0x20);
  uStack_1c = (undefined4)
              (CONCAT26(uStack_82,CONCAT24(a1[1]._6_2_,CONCAT22(uStack_84,a1[1]._4_2_))) >> 0x20);
  *(uint *)out[2] = CONCAT22(a0[1]._4_2_,in_local._4_2_);
  *(uint *)((long)out[2] + 4) = CONCAT22(uStack_84,a1[1]._4_2_);
  *(undefined4 *)(out[2] + 1) = uStack_c;
  *(undefined4 *)((long)out[2] + 0xc) = uStack_1c;
  out[3][0] = out[2][1];
  out[3][1] = 0;
  return;
}

Assistant:

static inline void transpose_16bit_4x4(const __m128i *const in,
                                       __m128i *const out) {
  // Unpack 16 bit elements. Goes from:
  // in[0]: 00 01 02 03  XX XX XX XX
  // in[1]: 10 11 12 13  XX XX XX XX
  // in[2]: 20 21 22 23  XX XX XX XX
  // in[3]: 30 31 32 33  XX XX XX XX
  // to:
  // a0:    00 10 01 11  02 12 03 13
  // a1:    20 30 21 31  22 32 23 33
  const __m128i a0 = _mm_unpacklo_epi16(in[0], in[1]);
  const __m128i a1 = _mm_unpacklo_epi16(in[2], in[3]);

  // Unpack 32 bit elements resulting in:
  // out[0]: 00 10 20 30  01 11 21 31
  // out[1]: 01 11 21 31  __ __ __ __
  // out[2]: 02 12 22 32  03 13 23 33
  // out[3]: 03 13 23 33  __ __ __ __
  //
  // Note: The high 64 bits of the output registers are shown for informational
  // purposes only. Callers should only use the low 64 bits of the output
  // registers. "__" indicates zeros.
  out[0] = _mm_unpacklo_epi32(a0, a1);
  out[1] = _mm_srli_si128(out[0], 8);
  out[2] = _mm_unpackhi_epi32(a0, a1);
  out[3] = _mm_srli_si128(out[2], 8);
}